

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void deleteTable(sqlite3 *db,Table *pTable)

{
  Index *pIVar1;
  sqlite3 *psVar2;
  VTable *pVVar3;
  FKey *p;
  int iVar4;
  VTable *pVVar5;
  FKey *pFVar6;
  VTable **ppVVar7;
  char *pKey;
  VTable *pVVar8;
  char **p_00;
  Index *p_01;
  long lVar9;
  
  p_01 = pTable->pIndex;
  while (p_01 != (Index *)0x0) {
    pIVar1 = p_01->pNext;
    if (((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) && (pTable->nModuleArg == 0)) {
      sqlite3HashInsert(&p_01->pSchema->idxHash,p_01->zName,(void *)0x0);
    }
    sqlite3FreeIndex(db,p_01);
    p_01 = pIVar1;
  }
  p = pTable->pFKey;
  while (p != (FKey *)0x0) {
    if ((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) {
      pFVar6 = p->pNextTo;
      if (p->pPrevTo == (FKey *)0x0) {
        if (pFVar6 == (FKey *)0x0) {
          pKey = p->zTo;
          pFVar6 = (FKey *)0x0;
        }
        else {
          pKey = pFVar6->zTo;
        }
        sqlite3HashInsert(&pTable->pSchema->fkeyHash,pKey,pFVar6);
      }
      else {
        p->pPrevTo->pNextTo = pFVar6;
      }
      if (p->pNextTo != (FKey *)0x0) {
        p->pNextTo->pPrevTo = p->pPrevTo;
      }
    }
    fkTriggerDelete(db,p->apTrigger[0]);
    fkTriggerDelete(db,p->apTrigger[1]);
    pFVar6 = p->pNextFrom;
    sqlite3DbFreeNN(db,p);
    p = pFVar6;
  }
  sqlite3DeleteColumnNames(db,pTable);
  if (pTable->zName != (char *)0x0) {
    sqlite3DbFreeNN(db,pTable->zName);
  }
  if (pTable->zColAff != (char *)0x0) {
    sqlite3DbFreeNN(db,pTable->zColAff);
  }
  if (pTable->pSelect != (Select *)0x0) {
    clearSelect(db,pTable->pSelect,1);
  }
  if (pTable->pCheck != (ExprList *)0x0) {
    exprListDeleteNN(db,pTable->pCheck);
  }
  if ((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) {
    pVVar5 = pTable->pVTable;
    pTable->pVTable = (VTable *)0x0;
    if (pVVar5 != (VTable *)0x0) {
      do {
        psVar2 = pVVar5->db;
        if (psVar2 == (sqlite3 *)0x0) {
          pVVar8 = (VTable *)0x0;
          ppVVar7 = &pTable->pVTable;
        }
        else {
          pVVar8 = psVar2->pDisconnect;
          ppVVar7 = &psVar2->pDisconnect;
        }
        pVVar3 = pVVar5->pNext;
        *ppVVar7 = pVVar5;
        pVVar5->pNext = pVVar8;
        pVVar5 = pVVar3;
      } while (pVVar3 != (VTable *)0x0);
    }
  }
  p_00 = pTable->azModuleArg;
  if (p_00 != (char **)0x0) {
    iVar4 = pTable->nModuleArg;
    if (0 < iVar4) {
      lVar9 = 0;
      do {
        if ((lVar9 != 1) && (pTable->azModuleArg[lVar9] != (char *)0x0)) {
          sqlite3DbFreeNN(db,pTable->azModuleArg[lVar9]);
          iVar4 = pTable->nModuleArg;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar4);
      p_00 = pTable->azModuleArg;
      if (p_00 == (char **)0x0) goto LAB_0016c3cf;
    }
    sqlite3DbFreeNN(db,p_00);
  }
LAB_0016c3cf:
  sqlite3DbFreeNN(db,pTable);
  return;
}

Assistant:

static void SQLITE_NOINLINE deleteTable(sqlite3 *db, Table *pTable){
  Index *pIndex, *pNext;

#ifdef SQLITE_DEBUG
  /* Record the number of outstanding lookaside allocations in schema Tables
  ** prior to doing any free() operations.  Since schema Tables do not use
  ** lookaside, this number should not change. */
  int nLookaside = 0;
  if( db && (pTable->tabFlags & TF_Ephemeral)==0 ){
    nLookaside = sqlite3LookasideUsed(db, 0);
  }
#endif

  /* Delete all indices associated with this table. */
  for(pIndex = pTable->pIndex; pIndex; pIndex=pNext){
    pNext = pIndex->pNext;
    assert( pIndex->pSchema==pTable->pSchema
         || (IsVirtual(pTable) && pIndex->idxType!=SQLITE_IDXTYPE_APPDEF) );
    if( (db==0 || db->pnBytesFreed==0) && !IsVirtual(pTable) ){
      char *zName = pIndex->zName; 
      TESTONLY ( Index *pOld = ) sqlite3HashInsert(
         &pIndex->pSchema->idxHash, zName, 0
      );
      assert( db==0 || sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
      assert( pOld==pIndex || pOld==0 );
    }
    sqlite3FreeIndex(db, pIndex);
  }

  /* Delete any foreign keys attached to this table. */
  sqlite3FkDelete(db, pTable);

  /* Delete the Table structure itself.
  */
  sqlite3DeleteColumnNames(db, pTable);
  sqlite3DbFree(db, pTable->zName);
  sqlite3DbFree(db, pTable->zColAff);
  sqlite3SelectDelete(db, pTable->pSelect);
  sqlite3ExprListDelete(db, pTable->pCheck);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  sqlite3VtabClear(db, pTable);
#endif
  sqlite3DbFree(db, pTable);

  /* Verify that no lookaside memory was used by schema tables */
  assert( nLookaside==0 || nLookaside==sqlite3LookasideUsed(db,0) );
}